

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Server::~Server(Server *this)

{
  this->_vptr_Server = (_func_int **)&PTR__Server_00292d30;
  detail::std::_Function_base::~_Function_base(&(this->header_writer_).super__Function_base);
  detail::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_httplib::detail::case_ignore::equal_to,_httplib::detail::case_ignore::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&(this->default_headers_)._M_h);
  detail::std::_Function_base::~_Function_base(&(this->socket_options_).super__Function_base);
  detail::std::_Function_base::~_Function_base(&(this->logger_).super__Function_base);
  detail::std::_Function_base::~_Function_base
            (&(this->expect_100_continue_handler_).super__Function_base);
  detail::std::_Function_base::~_Function_base(&(this->post_routing_handler_).super__Function_base);
  detail::std::_Function_base::~_Function_base(&(this->pre_routing_handler_).super__Function_base);
  detail::std::_Function_base::~_Function_base(&(this->exception_handler_).super__Function_base);
  detail::std::_Function_base::~_Function_base(&(this->error_handler_).super__Function_base);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->options_handlers_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->delete_handlers_for_content_reader_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->delete_handlers_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->patch_handlers_for_content_reader_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->patch_handlers_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->put_handlers_for_content_reader_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->put_handlers_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::~vector(&this->post_handlers_for_content_reader_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->post_handlers_);
  detail::std::
  vector<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::unique_ptr<httplib::detail::MatcherBase,_std::default_delete<httplib::detail::MatcherBase>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::~vector(&this->get_handlers_);
  detail::std::_Function_base::~_Function_base(&(this->file_request_handler_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->default_file_mimetype_);
  detail::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->file_extension_and_mimetype_map_)._M_t);
  detail::std::
  vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
  ~vector(&this->base_dirs_);
  detail::std::_Function_base::~_Function_base(&(this->new_task_queue).super__Function_base);
  return;
}

Assistant:

inline Server::~Server() = default;